

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

char get_FMchar(FMFieldPtr field,void *data)

{
  undefined4 uVar1;
  longlong lVar2;
  undefined1 auStack_20 [32];
  
  if (field->data_type == char_type) {
    return *(char *)((long)data + field->offset);
  }
  auStack_20._16_8_ = get_FMenum;
  get_FMchar_cold_1();
  auStack_20._0_8_ = field->offset;
  uVar1 = field->size;
  auStack_20[0x10] = field->byte_swap;
  auStack_20[0x11] = field->src_float_format;
  auStack_20[0x12] = field->target_float_format;
  auStack_20._19_5_ = *(undefined5 *)&field->field_0x13;
  auStack_20._12_4_ = integer_type;
  auStack_20._8_4_ = uVar1;
  lVar2 = get_big_int((FMFieldPtr)auStack_20,data);
  return (char)lVar2;
}

Assistant:

extern char
get_FMchar(FMFieldPtr field, void *data)
{
    if (field->data_type == char_type) {
	return (char) *((char *) data + field->offset);
    } else {
	fprintf(stderr, "Get Char failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}